

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O0

char * expand_text_(char *from,char **buf,int maxbuf,double maxw,int *n,double *width,int wrap,
                   int draw_symbols)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  double newwidth;
  byte *pbStack_70;
  int c;
  char *p;
  char *word_start;
  char *word_end;
  char *o;
  double w;
  char *e;
  int wrap_local;
  double *width_local;
  int *n_local;
  double maxw_local;
  int maxbuf_local;
  char **buf_local;
  char *from_local;
  
  w = (double)(*buf + (maxbuf + -4));
  underline_at = (char *)0x0;
  o = (char *)0x0;
  if ((expand_text_(char_const*,char*&,int,double,int&,double&,int,int)::local_buf == '\0') &&
     (iVar2 = __cxa_guard_acquire(&expand_text_(char_const*,char*&,int,double,int&,double&,int,int)
                                   ::local_buf), iVar2 != 0)) {
    expand_text_::local_buf = (char *)malloc((long)expand_text_::l_local_buff);
    __cxa_guard_release(&expand_text_(char_const*,char*&,int,double,int&,double&,int,int)::local_buf
                       );
  }
  if (maxbuf == 0) {
    *buf = expand_text_::local_buf;
    w = (double)(*buf + (long)expand_text_::l_local_buff + -4);
  }
  word_start = *buf;
  pbStack_70 = (byte *)from;
  p = from;
  word_end = word_start;
  do {
    bVar1 = *pbStack_70;
    if (((bVar1 == 0) || (bVar1 == 0x20)) || (bVar1 == 10)) {
      if ((p < pbStack_70) && (wrap != 0)) {
        dVar4 = fl_width(word_start,(int)word_end - (int)word_start);
        if ((*buf < word_start) && (maxw < (double)o + dVar4)) {
          word_end = word_start;
          pbStack_70 = (byte *)p;
LAB_00247aa3:
          dVar4 = fl_width(word_start,(int)word_end - (int)word_start);
          *width = (double)o + dVar4;
          *word_end = '\0';
          *n = (int)word_end - (int)*buf;
          return (char *)pbStack_70;
        }
        word_start = word_end;
        o = (char *)((double)o + dVar4);
      }
      if (bVar1 == 0) goto LAB_00247aa3;
      if (bVar1 == 10) {
        pbStack_70 = pbStack_70 + 1;
        goto LAB_00247aa3;
      }
      p = (char *)(pbStack_70 + 1);
    }
    if ((ulong)w < word_end) {
      if (maxbuf != 0) goto LAB_00247aa3;
      expand_text_::l_local_buff = expand_text_::l_local_buff + ((int)word_end - SUB84(w,0)) + 200;
      pcVar3 = (char *)realloc(expand_text_::local_buf,(long)expand_text_::l_local_buff);
      *buf = pcVar3;
      w = (double)(*buf + (long)expand_text_::l_local_buff + -4);
      word_end = *buf + ((long)word_end - (long)expand_text_::local_buf);
      word_start = *buf + ((long)word_start - (long)expand_text_::local_buf);
      expand_text_::local_buf = *buf;
    }
    if (bVar1 == 9) {
      iVar2 = fl_utf_nb_char((uchar *)*buf,(int)word_end - (int)*buf);
      for (newwidth._4_4_ = iVar2 % 8; newwidth._4_4_ < 8 && word_end < (ulong)w;
          newwidth._4_4_ = newwidth._4_4_ + 1) {
        *word_end = ' ';
        word_end = word_end + 1;
      }
    }
    else if (((bVar1 == 0x26) && (fl_draw_shortcut != '\0')) && (pbStack_70[1] != 0)) {
      if (pbStack_70[1] == 0x26) {
        pbStack_70 = pbStack_70 + 1;
        *word_end = '&';
        word_end = word_end + 1;
      }
      else if (fl_draw_shortcut != '\x02') {
        underline_at = word_end;
      }
    }
    else if ((bVar1 < 0x20) || (bVar1 == 0x7f)) {
      *word_end = '^';
      word_end[1] = bVar1 ^ 0x40;
      word_end = word_end + 2;
    }
    else {
      if ((bVar1 == 0x40) && (draw_symbols != 0)) {
        if ((pbStack_70[1] != 0) && (pbStack_70[1] != 0x40)) goto LAB_00247aa3;
        *word_end = '@';
        if (pbStack_70[1] != 0) {
          pbStack_70 = pbStack_70 + 1;
        }
      }
      else {
        *word_end = bVar1;
      }
      word_end = word_end + 1;
    }
    pbStack_70 = pbStack_70 + 1;
  } while( true );
}

Assistant:

static const char* expand_text_(const char* from, char*& buf, int maxbuf, double maxw, int& n,
	       double &width, int wrap, int draw_symbols) {
  char* e = buf+(maxbuf-4);
  underline_at = 0;
  double w = 0;
  static int l_local_buff = 500;
  static char *local_buf = (char*)malloc(l_local_buff); // initial buffer allocation
  if (maxbuf == 0) {
    buf = local_buf;
    e = buf + l_local_buff - 4;
    }
  char* o = buf;
  char* word_end = o;
  const char* word_start = from;

  const char* p = from;
  for (;; p++) {

    int c = *p & 255;

    if (!c || c == ' ' || c == '\n') {
      // test for word-wrap:
      if (word_start < p && wrap) {
	double newwidth = w + fl_width(word_end, (int) (o-word_end) );
	if (word_end > buf && newwidth > maxw) { // break before this word
	  o = word_end;
	  p = word_start;
	  break;
	}
	word_end = o;
	w = newwidth;
      }
      if (!c) break;
      else if (c == '\n') {p++; break;}
      word_start = p+1;
    }

    if (o > e) {
      if (maxbuf) break; // don't overflow buffer
      l_local_buff += (o - e) + 200; // enlarge buffer
      buf = (char*)realloc(local_buf, l_local_buff);
      e = buf + l_local_buff - 4; // update pointers to buffer content
      o = buf + (o - local_buf);
      word_end = buf + (word_end - local_buf);
      local_buf = buf;
    }

    if (c == '\t') {
      for (c = fl_utf_nb_char((uchar*)buf, (int) (o-buf) )%8; c<8 && o<e; c++)
           *o++ = ' ';
    } else if (c == '&' && fl_draw_shortcut && *(p+1)) {
      if (*(p+1) == '&') {p++; *o++ = '&';}
      else if (fl_draw_shortcut != 2) underline_at = o;
    } else if (c < ' ' || c == 127) { // ^X
      *o++ = '^';
      *o++ = c ^ 0x40;
/* This is in fact not useful: the point is that a valid UTF-8 sequence for a non-ascii char contains no ascii char,
 thus no tab, space, control, & or @ we want to process differently.
 Also, invalid UTF-8 sequences are copied unchanged by this procedure.
 Therefore, checking for tab, space, control, & or @, and copying the byte otherwise, is enough.
 } else  if (handle_utf8_seq(p, o)) { // figure out if we have an utf8 valid sequence before we determine the nbsp test validity:
#ifdef __APPLE__
    } else if (c == 0xCA) { // non-breaking space in MacRoman
#else
    } else if (c == 0xA0) { // non-breaking space in ISO 8859
#endif
      *o++ = ' ';*/
    } else if (c == '@' && draw_symbols) { // Symbol???
      if (p[1] && p[1] != '@')  break;
      *o++ = c;
      if (p[1]) p++;
    } else {
      *o++ = c;
    }
  }

  width = w + fl_width(word_end, (int) (o-word_end));
  *o = 0;
  n = (int) (o-buf);
  return p;
}